

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::RuleTests_RemainingSpanLexical_Test::TestBody(RuleTests_RemainingSpanLexical_Test *this)

{
  char *in_RCX;
  char *message;
  string_view line;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  AssertHelper local_f8;
  AssertionResult gtest_ar;
  Span s;
  AlignedSentencePair asp;
  PhrasalRule rule;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a c e\tb d f\t0-0 1-1 2-2";
  readAlignedSentencePair<false,false>(&asp,(thrax *)0x17,line);
  PhrasalRule::PhrasalRule(&rule,&asp);
  s.start = 0;
  s.end = 3;
  local_100.ptr_._0_4_ = PhrasalRule::remainingSource(&rule);
  testing::internal::CmpHelperEQ<jhu::thrax::Span,jhu::thrax::Span>
            ((internal *)&gtest_ar,"s","rule.remainingSource()",&s,(Span *)&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/rule_test.cpp"
               ,10,message);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  AlignedSentencePair::~AlignedSentencePair(&asp);
  return;
}

Assistant:

TEST(RuleTests, RemainingSpanLexical) {
  auto asp = readAlignedSentencePair<false, false>("a c e\tb d f\t0-0 1-1 2-2");
  PhrasalRule rule{asp};
  Span s{0, 3};
  EXPECT_EQ(s, rule.remainingSource());
}